

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O3

void __thiscall
cppcms::sessions::session_file_storage::~session_file_storage(session_file_storage *this)

{
  pointer paVar1;
  pointer pcVar2;
  _data *p_Var3;
  size_t __len;
  void *__addr;
  long lVar4;
  ulong uVar5;
  
  (this->super_session_storage)._vptr_session_storage = (_func_int **)&PTR_save_0028b140;
  __addr = this->memory_;
  if (__addr == (void *)0xffffffffffffffff) {
    if (this->lock_size_ != 0) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        pthread_mutex_destroy
                  ((pthread_mutex_t *)
                   ((long)(this->mutexes_).
                          super__Vector_base<pthread_mutex_t,_std::allocator<pthread_mutex_t>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar4));
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x28;
      } while (uVar5 < this->lock_size_);
    }
  }
  else {
    if (this->lock_size_ == 0) {
      __len = 0;
    }
    else {
      lVar4 = 0;
      uVar5 = 0;
      do {
        pthread_mutex_destroy((pthread_mutex_t *)((long)this->memory_ + lVar4));
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x28;
      } while (uVar5 < this->lock_size_);
      __addr = this->memory_;
      __len = (ulong)this->lock_size_ * 0x28;
    }
    munmap(__addr,__len);
  }
  paVar1 = (this->mutexes_).super__Vector_base<pthread_mutex_t,_std::allocator<pthread_mutex_t>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar1 != (pointer)0x0) {
    operator_delete(paVar1);
  }
  pcVar2 = (this->path_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->path_).field_2) {
    operator_delete(pcVar2);
  }
  p_Var3 = (this->d).ptr_;
  if (p_Var3 == (_data *)0x0) {
    return;
  }
  operator_delete(p_Var3);
  return;
}

Assistant:

session_file_storage::~session_file_storage()
{
	if(memory_ !=MAP_FAILED) {
		for(unsigned i=0;i<lock_size_;i++)
			destroy_mutex(reinterpret_cast<pthread_mutex_t *>(memory_) + i);
		munmap((char*)memory_,sizeof(pthread_mutex_t) * lock_size_);
	}
	else {
		for(unsigned i=0;i<lock_size_;i++)
			destroy_mutex(&mutexes_[i]);
	}
}